

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool anon_unknown.dwarf_124178a::processSources
               (cmGeneratorTarget *tgt,EvaluatedTargetPropertyEntries *entries,
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *srcs,unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *uniqueSrcs,bool debugSources)

{
  undefined8 uVar1;
  bool bVar2;
  cmMakefile *this;
  reference pEVar3;
  string *psVar4;
  reference sourceName;
  cmSourceFile *this_00;
  string *psVar5;
  ostream *poVar6;
  ulong uVar7;
  cmLocalGenerator *pcVar8;
  cmake *this_01;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar9;
  allocator<char> local_3f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_338;
  undefined1 local_330;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_328;
  undefined1 local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  string *src_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string usedSources;
  undefined1 local_2b8 [8];
  ostringstream err;
  undefined1 local_138 [16];
  undefined1 local_128 [24];
  cmake *cm;
  string fullPath;
  string w;
  string e;
  cmSourceFile *sf;
  string *src;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *targetName;
  cmLinkImplItem *item;
  EvaluatedTargetPropertyEntry *entry;
  iterator __end1;
  iterator __begin1;
  vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
  *__range1;
  bool contextDependent;
  cmMakefile *mf;
  bool debugSources_local;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *uniqueSrcs_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *srcs_local;
  EvaluatedTargetPropertyEntries *entries_local;
  cmGeneratorTarget *tgt_local;
  
  this = cmTarget::GetMakefile(tgt->Target);
  __range1._7_1_ = entries->HadContextSensitiveCondition & 1;
  __end1 = std::
           vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
           ::begin(&entries->Entries);
  entry = (EvaluatedTargetPropertyEntry *)
          std::
          vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
          ::end(&entries->Entries);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<(anonymous_namespace)::EvaluatedTargetPropertyEntry_*,_std::vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>_>
                                     *)&entry), bVar2) {
    pEVar3 = __gnu_cxx::
             __normal_iterator<(anonymous_namespace)::EvaluatedTargetPropertyEntry_*,_std::vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>_>
             ::operator*(&__end1);
    if ((pEVar3->ContextDependent & 1U) != 0) {
      __range1._7_1_ = 1;
    }
    psVar4 = cmLinkItem::AsStr_abi_cxx11_(&pEVar3->LinkImplItem->super_cmLinkItem);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&pEVar3->Values);
    src = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&pEVar3->Values);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&src), bVar2) {
      sourceName = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
      this_00 = cmMakefile::GetOrCreateSource(this,sourceName,false,Ambiguous);
      std::__cxx11::string::string((string *)(w.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(fullPath.field_2._M_local_buf + 8));
      psVar5 = cmSourceFile::ResolveFullPath
                         (this_00,(string *)(w.field_2._M_local_buf + 8),
                          (string *)(fullPath.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&stack0xffffffffffffff00,(string *)psVar5);
      pcVar8 = cmGeneratorTarget::GetLocalGenerator(tgt);
      local_128._16_8_ = cmLocalGenerator::GetCMakeInstance(pcVar8);
      uVar7 = std::__cxx11::string::empty();
      uVar1 = local_128._16_8_;
      if ((uVar7 & 1) == 0) {
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_128);
        cmake::IssueMessage((cmake *)uVar1,AUTHOR_WARNING,(string *)((long)&fullPath.field_2 + 8),
                            (cmListFileBacktrace *)local_128);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_128);
      }
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        uVar7 = std::__cxx11::string::empty();
        if (((uVar7 & 1) != 0) || (bVar2 = cmsys::SystemTools::FileIsFullPath(sourceName), bVar2)) {
          std::__cxx11::string::operator=((string *)sourceName,(string *)&stack0xffffffffffffff00);
          bVar2 = false;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            poVar6 = std::operator<<((ostream *)local_2b8,"Target \"");
            poVar6 = std::operator<<(poVar6,(string *)psVar4);
            poVar6 = std::operator<<(poVar6,
                                     "\" contains relative path in its INTERFACE_SOURCES:\n  \"");
            poVar6 = std::operator<<(poVar6,(string *)sourceName);
            std::operator<<(poVar6,"\"");
          }
          else {
            poVar6 = std::operator<<((ostream *)local_2b8,
                                     "Found relative path while evaluating sources of \"");
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar6 = std::operator<<(poVar6,(string *)psVar5);
            poVar6 = std::operator<<(poVar6,"\":\n  \"");
            poVar6 = std::operator<<(poVar6,(string *)sourceName);
            std::operator<<(poVar6,"\"\n");
          }
          pcVar8 = cmGeneratorTarget::GetLocalGenerator(tgt);
          std::__cxx11::ostringstream::str();
          cmLocalGenerator::IssueMessage
                    (pcVar8,FATAL_ERROR,(string *)((long)&usedSources.field_2 + 8));
          std::__cxx11::string::~string((string *)(usedSources.field_2._M_local_buf + 8));
          tgt_local._7_1_ = __range1._7_1_;
          bVar2 = true;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
        }
      }
      else {
        uVar7 = std::__cxx11::string::empty();
        uVar1 = local_128._16_8_;
        if ((uVar7 & 1) == 0) {
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_138);
          cmake::IssueMessage((cmake *)uVar1,FATAL_ERROR,(string *)((long)&w.field_2 + 8),
                              (cmListFileBacktrace *)local_138);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_138);
        }
        tgt_local._7_1_ = __range1._7_1_;
        bVar2 = true;
      }
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
      std::__cxx11::string::~string((string *)(fullPath.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(w.field_2._M_local_buf + 8));
      if (bVar2) goto LAB_0080848b;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::string((string *)&__range2_1);
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&pEVar3->Values);
    src_1 = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&pEVar3->Values);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&src_1), bVar2) {
      local_318 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_1);
      pVar9 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(uniqueSrcs,local_318);
      local_338._M_cur =
           (__node_type *)
           pVar9.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_330 = pVar9.second;
      local_328._M_cur = local_338._M_cur;
      local_320 = local_330;
      if ((((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
         (std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     srcs,local_318,&pEVar3->Backtrace), debugSources)) {
        std::operator+(&local_378," * ",local_318);
        std::operator+(&local_358,&local_378,"\n");
        std::__cxx11::string::operator+=((string *)&__range2_1,(string *)&local_358);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_378);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      pcVar8 = cmGeneratorTarget::GetLocalGenerator(tgt);
      this_01 = cmLocalGenerator::GetCMakeInstance(pcVar8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f8,"Used sources for target ",&local_3f9);
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
      std::operator+(&local_3d8,&local_3f8,psVar4);
      std::operator+(&local_3b8,&local_3d8,":\n");
      std::operator+(&local_398,&local_3b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &__range2_1);
      cmake::IssueMessage(this_01,LOG,&local_398,&pEVar3->Backtrace);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::allocator<char>::~allocator(&local_3f9);
    }
    std::__cxx11::string::~string((string *)&__range2_1);
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::EvaluatedTargetPropertyEntry_*,_std::vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>_>
    ::operator++(&__end1);
  }
  tgt_local._7_1_ = __range1._7_1_;
LAB_0080848b:
  return (bool)(tgt_local._7_1_ & 1);
}

Assistant:

bool processSources(cmGeneratorTarget const* tgt,
                    EvaluatedTargetPropertyEntries& entries,
                    std::vector<BT<std::string>>& srcs,
                    std::unordered_set<std::string>& uniqueSrcs,
                    bool debugSources)
{
  cmMakefile* mf = tgt->Target->GetMakefile();

  bool contextDependent = entries.HadContextSensitiveCondition;

  for (EvaluatedTargetPropertyEntry& entry : entries.Entries) {
    if (entry.ContextDependent) {
      contextDependent = true;
    }

    cmLinkImplItem const& item = entry.LinkImplItem;
    std::string const& targetName = item.AsStr();

    for (std::string& src : entry.Values) {
      cmSourceFile* sf = mf->GetOrCreateSource(src);
      std::string e;
      std::string w;
      std::string fullPath = sf->ResolveFullPath(&e, &w);
      cmake* cm = tgt->GetLocalGenerator()->GetCMakeInstance();
      if (!w.empty()) {
        cm->IssueMessage(MessageType::AUTHOR_WARNING, w, tgt->GetBacktrace());
      }
      if (fullPath.empty()) {
        if (!e.empty()) {
          cm->IssueMessage(MessageType::FATAL_ERROR, e, tgt->GetBacktrace());
        }
        return contextDependent;
      }

      if (!targetName.empty() && !cmSystemTools::FileIsFullPath(src)) {
        std::ostringstream err;
        if (!targetName.empty()) {
          err << "Target \"" << targetName
              << "\" contains relative path in its INTERFACE_SOURCES:\n  \""
              << src << "\"";
        } else {
          err << "Found relative path while evaluating sources of \""
              << tgt->GetName() << "\":\n  \"" << src << "\"\n";
        }
        tgt->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                               err.str());
        return contextDependent;
      }
      src = fullPath;
    }
    std::string usedSources;
    for (std::string const& src : entry.Values) {
      if (uniqueSrcs.insert(src).second) {
        srcs.emplace_back(src, entry.Backtrace);
        if (debugSources) {
          usedSources += " * " + src + "\n";
        }
      }
    }
    if (!usedSources.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used sources for target ") + tgt->GetName() + ":\n" +
          usedSources,
        entry.Backtrace);
    }
  }
  return contextDependent;
}